

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O2

Aig_Man_t * Inta_ManDeriveClauses(Inta_Man_t *pMan,Sto_Man_t *pCnf,int fClausesA)

{
  int iVar1;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pDriver;
  Aig_Obj_t *p1;
  uint uVar3;
  ulong uVar4;
  Sto_Cls_t *pSVar5;
  
  p = Aig_ManStart(10000);
  pDriver = p->pConst1;
  pSVar5 = (Sto_Cls_t *)&pCnf->pHead;
  while ((pSVar5 = pSVar5->pNext, pSVar5 != (Sto_Cls_t *)0x0 &&
         (uVar3 = *(uint *)&pSVar5->field_0x1c, (uVar3 & 2) != 0))) {
    if ((uVar3 & 1) == fClausesA) {
      p1 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
      for (uVar4 = 0; uVar4 < (uVar3 >> 3 & 0xffffff); uVar4 = uVar4 + 1) {
        iVar1 = *(int *)((long)&pSVar5[1].pNext + uVar4 * 4) >> 1;
        if (pMan->pVarTypes[iVar1] < 0) {
          uVar3 = ~pMan->pVarTypes[iVar1];
          if (pMan->vVarsAB->nSize <= (int)uVar3) {
            __assert_fail("VarAB >= 0 && VarAB < Vec_IntSize(pMan->vVarsAB)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterA.c"
                          ,0x42f,"Aig_Man_t *Inta_ManDeriveClauses(Inta_Man_t *, Sto_Man_t *, int)")
            ;
          }
        }
        else {
          uVar3 = iVar1 + pMan->vVarsAB->nSize + 1;
        }
        pAVar2 = Aig_IthVar(p,uVar3);
        p1 = Aig_Or(p,p1,(Aig_Obj_t *)
                         ((ulong)(*(uint *)((long)&pSVar5[1].pNext + uVar4 * 4) & 1) ^ (ulong)pAVar2
                         ));
        uVar3 = *(uint *)&pSVar5->field_0x1c;
      }
      pDriver = Aig_And(p,pDriver,p1);
    }
  }
  Aig_ObjCreateCo(p,pDriver);
  return p;
}

Assistant:

Aig_Man_t * Inta_ManDeriveClauses( Inta_Man_t * pMan, Sto_Man_t * pCnf, int fClausesA )
{
    Aig_Man_t * p;
    Aig_Obj_t * pMiter, * pSum, * pLit;
    Sto_Cls_t * pClause;
    int Var, VarAB, v;
    p = Aig_ManStart( 10000 );
    pMiter = Aig_ManConst1(p);
    Sto_ManForEachClauseRoot( pCnf, pClause )
    {
        if ( fClausesA ^ pClause->fA ) // clause of B
            continue;
        // clause of A
        pSum = Aig_ManConst0(p);
        for ( v = 0; v < (int)pClause->nLits; v++ )
        {
            Var = lit_var(pClause->pLits[v]);
            if ( pMan->pVarTypes[Var] < 0 ) // global var
            {
                VarAB = -pMan->pVarTypes[Var]-1;
                assert( VarAB >= 0 && VarAB < Vec_IntSize(pMan->vVarsAB) );
                pLit = Aig_NotCond( Aig_IthVar(p, VarAB), lit_sign(pClause->pLits[v]) );
            }
            else
                pLit = Aig_NotCond( Aig_IthVar(p, Vec_IntSize(pMan->vVarsAB)+1+Var), lit_sign(pClause->pLits[v]) );
            pSum = Aig_Or( p, pSum, pLit );
        }
        pMiter = Aig_And( p, pMiter, pSum );
    }
    Aig_ObjCreateCo( p, pMiter );
    return p;
}